

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

Vta_Man_t * Vga_ManStart(Gia_Man_t *pGia,Abs_Par_t *pPars)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  Vta_Man_t *pVVar5;
  Vta_Obj_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  Vec_Bit_t *pVVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  sat_solver2 *psVar12;
  Vec_Set_t *pVVar13;
  word **ppwVar14;
  word *pwVar15;
  uint uVar16;
  int iVar17;
  size_t __size;
  
  pVVar5 = (Vta_Man_t *)calloc(1,0xa8);
  pVVar5->pGia = pGia;
  pVVar5->pPars = pPars;
  pVVar5->nObjsAlloc = 0x40000;
  pVVar6 = (Vta_Obj_t *)calloc(0x40000,0x10);
  pVVar5->pObjs = pVVar6;
  pVVar5->nObjs = 1;
  uVar16 = 0x7ffff;
  while( true ) {
    do {
      uVar3 = uVar16 + 1;
      uVar4 = uVar16 & 1;
      uVar16 = uVar3;
    } while (uVar4 != 0);
    if (uVar3 < 9) break;
    iVar17 = 5;
    while (uVar3 % (iVar17 - 2U) != 0) {
      uVar4 = iVar17 * iVar17;
      iVar17 = iVar17 + 2;
      if (uVar3 < uVar4) goto LAB_005a6b75;
    }
  }
LAB_005a6b75:
  pVVar5->nBins = uVar3;
  piVar7 = (int *)calloc((long)(int)uVar3,4);
  pVVar5->pBins = piVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x3f5;
  pVVar8->nSize = 0;
  piVar7 = (int *)malloc(0xfd4);
  pVVar8->pArray = piVar7;
  pVVar5->vOrder = pVVar8;
  uVar3 = pGia->nObjs;
  uVar16 = uVar3 - 1;
  uVar4 = 0x1f;
  if (uVar16 != 0) {
    for (; uVar16 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = (uVar4 ^ 0xffffffe0) + 0x21;
  if (uVar3 < 2) {
    uVar4 = uVar3;
  }
  pVVar5->nObjBits = uVar4;
  uVar4 = ~(-1 << ((byte)uVar4 & 0x1f));
  pVVar5->nObjMask = uVar4;
  if ((int)uVar3 <= (int)uVar4) {
    pVVar5->nWords = 1;
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    uVar4 = 0x10;
    if (0xe < uVar16) {
      uVar4 = uVar3;
    }
    pVVar8->nCap = uVar4;
    if (uVar4 == 0) {
      piVar7 = (int *)0x0;
    }
    else {
      piVar7 = (int *)malloc((long)(int)uVar4 << 2);
    }
    pVVar8->pArray = piVar7;
    pVVar8->nSize = uVar3;
    __size = 0;
    memset(piVar7,0,(long)(int)uVar3 << 2);
    pVVar5->vSeens = pVVar8;
    iVar17 = (((int)uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1f) == 0);
    pVVar9 = (Vec_Bit_t *)malloc(0x10);
    pVVar9->nCap = iVar17 * 0x20;
    if (iVar17 == 0) {
      piVar7 = (int *)0x0;
    }
    else {
      __size = (long)iVar17 << 2;
      piVar7 = (int *)malloc(__size);
    }
    pVVar9->pArray = piVar7;
    pVVar9->nSize = iVar17 * 0x20;
    memset(piVar7,0,__size);
    pVVar5->vSeenGla = pVVar9;
    pVVar5->nSeenGla = 1;
    pVVar5->nSeenAll = 1;
    pVVar10 = (Vec_Ptr_t *)malloc(0x10);
    pVVar10->nCap = 100;
    pVVar10->nSize = 0;
    ppvVar11 = (void **)malloc(800);
    pVVar10->pArray = ppvVar11;
    pVVar5->vCores = pVVar10;
    psVar12 = sat_solver2_new();
    pVVar5->pSat = psVar12;
    pVVar13 = (Vec_Set_t *)calloc(1,0x20);
    pVVar13->nPageSize = 0x14;
    pVVar13->uPageMask = 0xfffff;
    pVVar13->nPagesAlloc = 0x100;
    ppwVar14 = (word **)calloc(0x100,8);
    pVVar13->pPages = ppwVar14;
    pwVar15 = (word *)malloc(0x800000);
    *ppwVar14 = pwVar15;
    pwVar15[1] = 0xffffffffffffffff;
    *pwVar15 = 2;
    psVar12->pPrf1 = pVVar13;
    uVar1 = pPars->nLearnedDelta;
    uVar2 = pPars->nLearnedPerce;
    iVar17 = pPars->nLearnedStart;
    psVar12->nLearntMax = iVar17;
    psVar12->nLearntStart = iVar17;
    psVar12->nLearntDelta = uVar1;
    psVar12->nLearntRatio = uVar2;
    if (pGia->vObjClasses != (Vec_Int_t *)0x0) {
      pVVar10 = Gia_VtaAbsToFrames(pGia->vObjClasses);
      pVVar5->vFrames = pVVar10;
      pVVar8 = (Vec_Int_t *)malloc(0x10);
      pVVar8->nCap = 1000;
      pVVar8->nSize = 0;
      piVar7 = (int *)malloc(4000);
      pVVar8->pArray = piVar7;
      pVVar5->vAddedNew = pVVar8;
      return pVVar5;
    }
    __assert_fail("pGia->vObjClasses != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0x3f8,"Vta_Man_t *Vga_ManStart(Gia_Man_t *, Abs_Par_t *)");
  }
  __assert_fail("Gia_ManObjNum(pGia) <= (int)p->nObjMask",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                ,999,"Vta_Man_t *Vga_ManStart(Gia_Man_t *, Abs_Par_t *)");
}

Assistant:

Vta_Man_t * Vga_ManStart( Gia_Man_t * pGia, Abs_Par_t * pPars )
{
    Vta_Man_t * p;
    p = ABC_CALLOC( Vta_Man_t, 1 );
    p->pGia        = pGia;
    p->pPars       = pPars;
    // internal data
    p->nObjsAlloc  = (1 << 18);
    p->pObjs       = ABC_CALLOC( Vta_Obj_t, p->nObjsAlloc );
    p->nObjs       = 1;
    p->nBins       = Abc_PrimeCudd( 2*p->nObjsAlloc );
    p->pBins       = ABC_CALLOC( int, p->nBins );
    p->vOrder      = Vec_IntAlloc( 1013 );
    // abstraction
    p->nObjBits    = Abc_Base2Log( Gia_ManObjNum(pGia) );
    p->nObjMask    = (1 << p->nObjBits) - 1;
    assert( Gia_ManObjNum(pGia) <= (int)p->nObjMask );
    p->nWords      = 1;
    p->vSeens      = Vec_IntStart( Gia_ManObjNum(pGia) * p->nWords );
    p->vSeenGla    = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->nSeenGla    = 1;
    p->nSeenAll    = 1;
    // other data
    p->vCores      = Vec_PtrAlloc( 100 );
    p->pSat        = sat_solver2_new();
    p->pSat->pPrf1 = Vec_SetAlloc( 20 );
//    p->pSat->fVerbose = p->pPars->fVerbose;
//    sat_solver2_set_learntmax( p->pSat, pPars->nLearnedMax );
    p->pSat->nLearntStart = p->pPars->nLearnedStart;
    p->pSat->nLearntDelta = p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio = p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    // start the abstraction
    assert( pGia->vObjClasses != NULL );
    p->vFrames = Gia_VtaAbsToFrames( pGia->vObjClasses );
    p->vAddedNew   = Vec_IntAlloc( 1000 );
    return p;
}